

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFile(DescriptorPool *this,FileDescriptorProto *proto)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  LogFinisher local_d9;
  undefined1 local_d8 [56];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  _Rb_tree_node_base local_68;
  size_t local_48;
  FileDescriptor *pFStack_40;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9c5);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_d8,"CHECK failed: fallback_database_ == NULL: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=(&local_d9,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_d8);
  }
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9c9);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_d8,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=(&local_d9,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_d8);
  }
  local_d8._8_8_ = (this->tables_).ptr_;
  local_a0._M_p = (pointer)local_90;
  local_d8._16_8_ = (ErrorCollector *)0x0;
  local_d8._24_8_ = (pointer)0x0;
  local_d8._32_8_ = (pointer)0x0;
  local_d8._40_8_ = 0;
  local_d8[0x30] = '\0';
  local_98 = 0;
  local_90[0]._M_local_buf[0] = '\0';
  local_68._M_left = &local_68;
  local_68._M_color = _S_red;
  local_68._M_parent = (_Base_ptr)0x0;
  local_38._M_p = (pointer)&local_28;
  local_48 = 0;
  pFStack_40 = (FileDescriptor *)0x0;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_d8._0_8_ = this;
  local_68._M_right = local_68._M_left;
  pFVar2 = DescriptorBuilder::BuildFile((DescriptorBuilder *)local_d8,proto);
  DescriptorBuilder::~DescriptorBuilder((DescriptorBuilder *)local_d8);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFile(
    const FileDescriptorProto& proto) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  return DescriptorBuilder(this, tables_.get(), NULL).BuildFile(proto);
}